

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_buildCTable_wksp
                 (HUF_CElt *tree,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  char *pcVar1;
  byte bVar2;
  U16 UVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  U32 val;
  byte bVar20;
  U32 UVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar31 [64];
  size_t sStack_180;
  U16 valPerRank [13];
  uint uStack_13c;
  U16 nbPerRank [13];
  undefined1 auVar29 [24];
  undefined1 auVar30 [26];
  
  if (((ulong)workSpace & 3) == 0) {
    if (wkspSize < 0x1000) {
      sStack_180 = 0xffffffffffffffbe;
    }
    else {
      uVar7 = 0xb;
      if (maxNbBits != 0) {
        uVar7 = maxNbBits;
      }
      if (maxSymbolValue < 0x100) {
        memset(workSpace,0,0x1000);
        auVar31 = ZEXT1664((undefined1  [16])0x0);
        nbPerRank._0_4_ = auVar31._0_4_;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank._4_4_ = auVar31._4_4_;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = auVar31._8_2_;
        nbPerRank._10_6_ = auVar31._10_6_;
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        uVar27 = (ulong)(maxSymbolValue + 1);
        for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
          uVar10 = BIT_highbit32(count[uVar19] + 1);
          *(int *)(nbPerRank + (ulong)uVar10 * 4) = *(int *)(nbPerRank + (ulong)uVar10 * 4) + 1;
        }
        for (uVar19 = 0x1d; uVar19 != 0xffffffffffffffff; uVar19 = uVar19 - 1) {
          *(int *)(nbPerRank + (uVar19 & 0xffffffff) * 4) =
               *(int *)(nbPerRank + (uVar19 & 0xffffffff) * 4) +
               *(int *)(nbPerRank + uVar19 * 4 + 4);
        }
        for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
          *(undefined4 *)(nbPerRank + lVar13 * 4 + 2) = *(undefined4 *)(nbPerRank + lVar13 * 4);
        }
        for (uVar19 = 0; uVar19 != uVar27; uVar19 = uVar19 + 1) {
          uVar10 = count[uVar19];
          uVar11 = BIT_highbit32(uVar10 + 1);
          uVar18 = (ulong)uVar11;
          uVar11 = *(uint *)(nbPerRank + uVar18 * 4 + 4);
          uVar4 = *(uint *)(nbPerRank + uVar18 * 4 + 6);
          uVar14 = (ulong)uVar4;
          *(uint *)(nbPerRank + uVar18 * 4 + 6) = uVar4 + 1;
          uVar18 = (ulong)uVar4;
          if (uVar11 < uVar4) {
            uVar18 = (ulong)uVar11;
          }
          for (; uVar11 < uVar14; uVar14 = uVar14 - 1) {
            uVar17 = (ulong)((int)uVar14 - 1);
            if (uVar10 <= *(uint *)((long)workSpace + uVar17 * 8 + 8)) {
              uVar18 = uVar14 & 0xffffffff;
              break;
            }
            *(undefined8 *)((long)workSpace + uVar14 * 8 + 8) =
                 *(undefined8 *)((long)workSpace + uVar17 * 8 + 8);
          }
          *(uint *)((long)workSpace + uVar18 * 8 + 8) = uVar10;
          *(char *)((long)workSpace + uVar18 * 8 + 0xe) = (char)uVar19;
        }
        uVar10 = maxSymbolValue - 1;
        do {
          uVar11 = uVar10;
          uVar10 = uVar11 - 1;
        } while (*(int *)((long)workSpace + (ulong)(uVar11 + 1) * 8 + 8) == 0);
        uVar23 = uVar11 + 0x100;
        lVar13 = (long)(int)(uVar11 + 1);
        *(int *)((long)workSpace + 0x808) =
             *(int *)((long)workSpace + lVar13 * 8) + *(int *)((long)workSpace + lVar13 * 8 + 8);
        *(undefined2 *)((long)workSpace + lVar13 * 8 + 4) = 0x100;
        *(undefined2 *)((long)workSpace + lVar13 * 8 + 0xc) = 0x100;
        uVar4 = uVar11 + 2;
        uVar19 = (ulong)(uVar11 + 0xff);
        for (uVar14 = 0x101; uVar14 <= uVar23; uVar14 = uVar14 + 1) {
          *(undefined4 *)((long)workSpace + uVar14 * 8 + 8) = 0x40000000;
        }
        *(undefined4 *)workSpace = 0x80000000;
        uVar14 = 0x101;
        uVar25 = 0x100;
        while( true ) {
          uVar22 = (uint)(uVar14 & 0xffff);
          if (uVar23 < uVar22) break;
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar10 * 8 + 8);
          uVar6 = *(uint *)((long)workSpace + (long)(int)uVar25 * 8 + 8);
          uVar26 = (uVar25 + 1) - (uint)(uVar5 < uVar6);
          uVar8 = uVar25;
          if (uVar5 < uVar6) {
            uVar8 = uVar10;
          }
          uVar25 = (uint)(uVar5 < uVar6);
          uVar24 = uVar10 - uVar25;
          uVar5 = *(uint *)((long)workSpace + (long)(int)uVar24 * 8 + 8);
          uVar6 = *(uint *)((long)workSpace + (long)(int)uVar26 * 8 + 8);
          uVar10 = (uVar10 - uVar25) - (uint)(uVar5 < uVar6);
          uVar25 = (uVar26 + 1) - (uint)(uVar5 < uVar6);
          if (uVar6 <= uVar5) {
            uVar24 = uVar26;
          }
          *(int *)((long)workSpace + (uVar14 & 0xffff) * 8 + 8) =
               *(int *)((long)workSpace + (ulong)uVar24 * 8 + 8) +
               *(int *)((long)workSpace + (ulong)uVar8 * 8 + 8);
          *(short *)((long)workSpace + (ulong)uVar24 * 8 + 0xc) = (short)uVar14;
          *(short *)((long)workSpace + (ulong)uVar8 * 8 + 0xc) = (short)uVar14;
          uVar14 = (ulong)(uVar22 + 1);
        }
        *(undefined1 *)((long)workSpace + (ulong)uVar23 * 8 + 0xf) = 0;
        for (; 0xff < uVar19; uVar19 = uVar19 - 1) {
          *(char *)((long)workSpace + uVar19 * 8 + 0xf) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar19 * 8 + 0xc) * 8 + 0xf) + '\x01';
        }
        for (uVar19 = 0; uVar4 != uVar19; uVar19 = uVar19 + 1) {
          *(char *)((long)workSpace + uVar19 * 8 + 0xf) =
               *(char *)((long)workSpace +
                        (ulong)*(ushort *)((long)workSpace + uVar19 * 8 + 0xc) * 8 + 0xf) + '\x01';
        }
        bVar2 = *(byte *)((long)workSpace + (ulong)(uVar11 + 1) * 8 + 0xf);
        iVar12 = bVar2 - uVar7;
        uVar10 = (uint)bVar2;
        if (uVar7 <= bVar2 && iVar12 != 0) {
          bVar15 = (byte)iVar12;
          iVar12 = 0;
          bVar20 = bVar2;
          while (uVar19 = (ulong)uVar11, uVar7 < bVar20) {
            iVar12 = iVar12 + (1 << (bVar15 & 0x1f)) + (-1 << (bVar2 - bVar20 & 0x1f));
            *(char *)((long)workSpace + (ulong)(uVar11 + 1) * 8 + 0xf) = (char)uVar7;
            uVar11 = uVar11 - 1;
            bVar20 = *(byte *)((long)workSpace + uVar19 * 8 + 0xf);
          }
          uVar19 = (ulong)(uVar11 + 2);
          do {
            uVar19 = (ulong)((int)uVar19 - 1);
          } while (uVar7 == *(byte *)((long)workSpace + uVar19 * 8 + 0xf));
          auVar28._0_10_ = CONCAT19(0xf0,CONCAT18(0xf0,0xf0f0f0f0f0f0f0f0));
          auVar28[10] = 0xf0;
          auVar28[0xb] = 0xf0;
          auVar28[0xc] = 0xf0;
          auVar28[0xd] = 0xf0;
          auVar28[0xe] = 0xf0;
          auVar28[0xf] = 0xf0;
          auVar29[0x10] = 0xf0;
          auVar29._0_16_ = auVar28;
          auVar29[0x11] = 0xf0;
          auVar29[0x12] = 0xf0;
          auVar29[0x13] = 0xf0;
          auVar29[0x14] = 0xf0;
          auVar29[0x15] = 0xf0;
          auVar29[0x16] = 0xf0;
          auVar29[0x17] = 0xf0;
          auVar30[0x18] = 0xf0;
          auVar30._0_24_ = auVar29;
          auVar30[0x19] = 0xf0;
          nbPerRank[0] = 0xf0f0;
          nbPerRank[1] = 0xf0f0;
          nbPerRank[2] = 0xf0f0;
          nbPerRank[3] = 0xf0f0;
          nbPerRank[4] = (U16)((unkuint10)auVar28._0_10_ >> 0x40);
          nbPerRank._10_6_ = auVar28._10_6_;
          nbPerRank._16_8_ = auVar29._16_8_;
          nbPerRank[0xc] = auVar30._24_2_;
          uVar14 = uVar19;
          uVar10 = uVar7;
          while (iVar16 = (int)uVar14, -1 < iVar16) {
            bVar20 = *(byte *)((long)workSpace + uVar14 * 8 + 0xf);
            if (bVar20 < uVar10) {
              uVar10 = (uint)bVar20;
              *(int *)(nbPerRank + (ulong)(uVar7 - uVar10) * 2) = iVar16;
            }
            uVar14 = (ulong)(iVar16 - 1);
          }
          val = iVar12 >> (bVar15 & 0x1f);
          do {
            if ((int)val < 1) {
              uVar14 = (ulong)(uint)nbPerRank._4_4_;
              do {
                uVar11 = (uint)uVar14;
                iVar12 = uVar11 + 0xf0f0f10;
                iVar16 = 0;
                UVar21 = val;
                while( true ) {
                  uVar11 = uVar11 + 1;
                  uVar10 = uVar7;
                  if (-1 < (int)UVar21) goto LAB_0010c3b9;
                  uVar14 = uVar19;
                  if (iVar12 == iVar16) break;
                  pcVar1 = (char *)((long)workSpace + (ulong)uVar11 * 8 + 0xf);
                  *pcVar1 = *pcVar1 + -1;
                  UVar21 = UVar21 + 1;
                  iVar16 = iVar16 + -1;
                }
                do {
                  uVar19 = uVar14;
                  uVar14 = (ulong)((int)uVar19 - 1);
                } while (uVar7 == *(byte *)((long)workSpace + uVar19 * 8 + 0xf));
                uVar14 = (ulong)((int)uVar19 + 1);
                pcVar1 = (char *)((long)workSpace + uVar14 * 8 + 0xf);
                *pcVar1 = *pcVar1 + -1;
                val = (val - iVar16) + 1;
              } while( true );
            }
            uVar10 = BIT_highbit32(val);
            for (uVar14 = (ulong)(uVar10 + 1); 1 < uVar14; uVar14 = uVar14 - 1) {
              if (((ulong)*(uint *)(nbPerRank + uVar14 * 2) != 0xf0f0f0f0) &&
                 (((&uStack_13c)[uVar14] == 0xf0f0f0f0 ||
                  (*(uint *)((long)workSpace + (ulong)*(uint *)(nbPerRank + uVar14 * 2) * 8 + 8) <=
                   (uint)(*(int *)((long)workSpace + (ulong)(&uStack_13c)[uVar14] * 8 + 8) * 2)))))
              goto LAB_0010c2ec;
            }
            uVar14 = 1;
LAB_0010c2ec:
            uVar17 = uVar14 & 0xffffffff;
            uVar18 = uVar14 & 0xffffffff;
            if ((uint)uVar14 < 0xe) {
              uVar18 = 0xd;
            }
            for (; uVar10 = (uint)uVar18, uVar17 < 0xd; uVar17 = uVar17 + 1) {
              if (*(int *)(nbPerRank + uVar17 * 2) != -0xf0f0f10) {
                uVar10 = (uint)uVar17;
                break;
              }
            }
            uVar25 = uVar10 - 1;
            uVar11 = *(uint *)(nbPerRank + (ulong)uVar10 * 2);
            uVar23 = *(uint *)(nbPerRank + (ulong)uVar25 * 2);
            if (*(uint *)(nbPerRank + (ulong)uVar25 * 2) == 0xf0f0f0f0) {
              uVar23 = uVar11;
            }
            *(uint *)(nbPerRank + (ulong)uVar25 * 2) = uVar23;
            pcVar1 = (char *)((long)workSpace + (ulong)uVar11 * 8 + 0xf);
            *pcVar1 = *pcVar1 + '\x01';
            if ((ulong)uVar11 == 0) {
              uVar11 = 0xf0f0f0f0;
            }
            else {
              uVar11 = uVar11 - 1;
              if (uVar7 - uVar10 != (uint)*(byte *)((long)workSpace + (ulong)uVar11 * 8 + 0xf)) {
                uVar11 = 0xf0f0f0f0;
              }
            }
            val = val + (-1 << ((byte)uVar25 & 0x1f));
            *(uint *)(nbPerRank + (ulong)uVar10 * 2) = uVar11;
          } while( true );
        }
LAB_0010c3b9:
        nbPerRank[8] = 0;
        nbPerRank[9] = 0;
        nbPerRank[10] = 0;
        nbPerRank[0xb] = 0;
        nbPerRank[0xc] = 0;
        nbPerRank[0] = 0;
        nbPerRank[1] = 0;
        nbPerRank[2] = 0;
        nbPerRank[3] = 0;
        nbPerRank[4] = 0;
        nbPerRank[5] = 0;
        nbPerRank[6] = 0;
        nbPerRank[7] = 0;
        valPerRank._16_10_ = SUB1610((undefined1  [16])0x0,6);
        valPerRank._0_10_ = SUB1610((undefined1  [16])0x0,0);
        valPerRank[5] = 0;
        valPerRank[6] = 0;
        valPerRank[7] = 0;
        if (uVar10 < 0xd) {
          for (uVar19 = 0; uVar4 != uVar19; uVar19 = uVar19 + 1) {
            nbPerRank[*(byte *)((long)workSpace + uVar19 * 8 + 0xf)] =
                 nbPerRank[*(byte *)((long)workSpace + uVar19 * 8 + 0xf)] + 1;
          }
          uVar19 = (ulong)bVar2;
          if ((ulong)uVar7 < (ulong)bVar2) {
            uVar19 = (ulong)uVar7;
          }
          uVar9 = 0;
          while (uVar19 != 0) {
            valPerRank[uVar19] = uVar9;
            uVar9 = (ushort)(uVar9 + nbPerRank[uVar19]) >> 1;
            uVar19 = uVar19 - 1;
          }
          for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
            tree[*(byte *)((long)workSpace + uVar19 * 8 + 0xe)].nbBits =
                 *(BYTE *)((long)workSpace + uVar19 * 8 + 0xf);
          }
          for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
            UVar3 = valPerRank[tree[uVar19].nbBits];
            valPerRank[tree[uVar19].nbBits] = UVar3 + 1;
            tree[uVar19].val = UVar3;
          }
        }
        sStack_180 = 0xffffffffffffffff;
        if (uVar10 < 0xd) {
          sStack_180 = (ulong)uVar10;
        }
      }
      else {
        sStack_180 = 0xffffffffffffffd2;
      }
    }
  }
  else {
    sStack_180 = 0xffffffffffffffff;
  }
  return sStack_180;
}

Assistant:

size_t HUF_buildCTable_wksp (HUF_CElt* tree, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits, void* workSpace, size_t wkspSize)
{
    nodeElt* const huffNode0 = (nodeElt*)workSpace;
    nodeElt* const huffNode = huffNode0+1;
    U32 n, nonNullRank;
    int lowS, lowN;
    U16 nodeNb = STARTNODE;
    U32 nodeRoot;

    /* safety checks */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(huffNodeTable)) return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue);

    /* init for parents */
    nonNullRank = maxSymbolValue;
    while(huffNode[nonNullRank].count == 0) nonNullRank--;
    lowS = nonNullRank; nodeRoot = nodeNb + lowS - 1; lowN = nodeNb;
    huffNode[nodeNb].count = huffNode[lowS].count + huffNode[lowS-1].count;
    huffNode[lowS].parent = huffNode[lowS-1].parent = nodeNb;
    nodeNb++; lowS-=2;
    for (n=nodeNb; n<=nodeRoot; n++) huffNode[n].count = (U32)(1U<<30);
    huffNode0[0].count = (U32)(1U<<31);  /* fake entry, strong barrier */

    /* create parents */
    while (nodeNb <= nodeRoot) {
        U32 n1 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        U32 n2 = (huffNode[lowS].count < huffNode[lowN].count) ? lowS-- : lowN++;
        huffNode[nodeNb].count = huffNode[n1].count + huffNode[n2].count;
        huffNode[n1].parent = huffNode[n2].parent = nodeNb;
        nodeNb++;
    }

    /* distribute weights (unlimited tree height) */
    huffNode[nodeRoot].nbBits = 0;
    for (n=nodeRoot-1; n>=STARTNODE; n--)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;
    for (n=0; n<=nonNullRank; n++)
        huffNode[n].nbBits = huffNode[ huffNode[n].parent ].nbBits + 1;

    /* enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, nonNullRank, maxNbBits);

    /* fill result into tree (val, nbBits) */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+1] = {0};
        U16 valPerRank[HUF_TABLELOG_MAX+1] = {0};
        if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */
        for (n=0; n<=nonNullRank; n++)
            nbPerRank[huffNode[n].nbBits]++;
        /* determine stating value per rank */
        {   U16 min = 0;
            for (n=maxNbBits; n>0; n--) {
                valPerRank[n] = min;      /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        for (n=0; n<=maxSymbolValue; n++)
            tree[huffNode[n].byte].nbBits = huffNode[n].nbBits;   /* push nbBits per symbol, symbol order */
        for (n=0; n<=maxSymbolValue; n++)
            tree[n].val = valPerRank[tree[n].nbBits]++;   /* assign value within rank, symbol order */
    }

    return maxNbBits;
}